

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

float duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<bool,float>
                (bool input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  VectorTryCastData *data;
  float output;
  bool in_stack_0000018f;
  float *in_stack_ffffffffffffff98;
  VectorTryCastData *cast_data;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ValidityMask *in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  float local_24;
  float local_4;
  
  bVar1 = NumericTryCast::Operation<bool,float>
                    (SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0),in_stack_ffffffffffffff98,
                     false);
  if (bVar1) {
    local_4 = local_24;
  }
  else {
    cast_data = (VectorTryCastData *)&stack0xffffffffffffffb0;
    CastExceptionText<bool,float>(in_stack_0000018f);
    local_4 = HandleVectorCastError::Operation<float>
                        ((string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),cast_data);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return local_4;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}